

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::genImage
               (Functions *gl,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *levels,ImageInfo *info,deUint32 moreRestrictiveFormat)

{
  deUint32 dVar1;
  deUint32 target;
  deUint32 internalFormat;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  TextureChannelClass TVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  TextureFormat TVar10;
  TransferFormat TVar11;
  TransferFormat TVar12;
  int level;
  size_t __n;
  ulong uVar13;
  long lVar14;
  char *msg;
  void *pvVar15;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar16;
  TextureFormat format;
  IVec4 color;
  Vector<float,_4> local_104;
  IVec3 size;
  ConstPixelBufferAccess texelAccess;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texelBlock;
  Framebuffer framebuffer;
  PixelBufferAccess refAccess;
  
  if (info->m_target != 0x8d41) {
    iVar3 = getTexelBlockSize(info->m_format);
    getTexelBlockPixelSize((anon_unknown_0 *)&refAccess,info->m_format);
    iVar6 = getLevelCount(info);
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(levels,(long)iVar6);
    (*gl->pixelStorei)(0xcf5,1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Setting pixel store aligment failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33c);
    (*gl->bindTexture)(info->m_target,name);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Binding texture failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33f);
    lVar14 = 0;
    do {
      iVar6 = getLevelCount(info);
      dVar1 = info->m_target;
      if (iVar6 <= lVar14) {
        (*gl->texParameteri)(dVar1,0x2802,0x812f);
        (*gl->texParameteri)(info->m_target,0x2803,0x812f);
        GVar4 = info->m_target;
        if (GVar4 == 0x806f) {
          (*gl->texParameteri)(0x806f,0x8072,0x812f);
          GVar4 = info->m_target;
        }
        (*gl->texParameteri)(GVar4,0x2801,0x2600);
        (*gl->texParameteri)(info->m_target,0x2800,0x2600);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Setting texture parameters failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                        ,0x35e);
        (*gl->bindTexture)(info->m_target,0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Unbinding texture failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                        ,0x361);
        return;
      }
      pAVar16 = (levels->
                super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar14;
      level = (int)lVar14;
      getLevelSize((anon_unknown_0 *)&texelAccess,dVar1,&info->m_size,level);
      divRoundUp((anon_unknown_0 *)&framebuffer,(IVec3 *)&texelAccess,(IVec3 *)&refAccess);
      iVar6 = framebuffer.super_ObjectWrapper.m_gl._4_4_ * (int)framebuffer.super_ObjectWrapper.m_gl
              * (int)framebuffer.super_ObjectWrapper.m_traits;
      iVar7 = iVar6 * iVar3;
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
                (pAVar16,(long)(int)(((uint)(dVar1 == 0x8513) * 5 + 1) * iVar7));
      iVar9 = 0;
      for (uVar13 = 0; (uint)(dVar1 == 0x8513) * 0x14 + 4 != uVar13; uVar13 = uVar13 + 4) {
        genTexel(rng,moreRestrictiveFormat,iVar3,iVar6,
                 (deUint8 *)((long)pAVar16->m_ptr + (long)iVar9));
        target = info->m_target;
        GVar4 = target;
        if (target == 0x8513) {
          GVar4 = *(GLenum *)((long)&DAT_018dfa60 + uVar13);
        }
        internalFormat = info->m_format;
        pvVar15 = (void *)((long)iVar9 + (long)pAVar16->m_ptr);
        bVar2 = glu::isCompressedFormat(internalFormat);
        if (bVar2) {
          iVar8 = getTargetTexDims(target);
          if (iVar8 == 3) {
            (*gl->compressedTexImage3D)
                      (GVar4,level,internalFormat,texelAccess.m_format.order,
                       texelAccess.m_format.type,texelAccess.m_size.m_data[0],0,iVar7,pvVar15);
            GVar4 = (*gl->getError)();
            msg = "glCompressedTexImage3D failed.";
            iVar8 = 0x310;
            goto LAB_013a25a4;
          }
          if (iVar8 == 2) {
            (*gl->compressedTexImage2D)
                      (GVar4,level,internalFormat,texelAccess.m_format.order,
                       texelAccess.m_format.type,0,iVar7,pvVar15);
            GVar4 = (*gl->getError)();
            msg = "glCompressedTexImage2D failed.";
            iVar8 = 0x30b;
            goto LAB_013a25a4;
          }
        }
        else {
          TVar10 = glu::mapGLInternalFormat(internalFormat);
          TVar11 = glu::getTransferFormat(TVar10);
          TVar10 = glu::mapGLInternalFormat(internalFormat);
          TVar12 = glu::getTransferFormat(TVar10);
          iVar8 = getTargetTexDims(target);
          if (iVar8 == 3) {
            (*gl->texImage3D)(GVar4,level,internalFormat,texelAccess.m_format.order,
                              texelAccess.m_format.type,texelAccess.m_size.m_data[0],0,TVar11.format
                              ,TVar12.dataType,pvVar15);
            GVar4 = (*gl->getError)();
            msg = "glTexImage3D failed.";
            iVar8 = 0x326;
          }
          else {
            if (iVar8 != 2) goto LAB_013a25a9;
            (*gl->texImage2D)(GVar4,level,internalFormat,texelAccess.m_format.order,
                              texelAccess.m_format.type,0,TVar11.format,TVar12.dataType,pvVar15);
            GVar4 = (*gl->getError)();
            msg = "glTexImage2D failed.";
            iVar8 = 0x321;
          }
LAB_013a25a4:
          glu::checkError(GVar4,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                          ,iVar8);
        }
LAB_013a25a9:
        iVar9 = iVar9 + iVar7;
      }
      lVar14 = lVar14 + 1;
    } while( true );
  }
  tcu::Vector<int,_3>::Vector(&size,&info->m_size);
  format = glu::mapGLInternalFormat(info->m_format);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&framebuffer,gl);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(levels,1);
  pAVar16 = (levels->
            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = tcu::TextureFormat::getPixelSize(&format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (pAVar16,(long)(iVar3 * size.m_data[0] * size.m_data[1]));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&refAccess,&format,size.m_data[0],size.m_data[1],1,
             ((levels->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  (*gl->bindRenderbuffer)(0x8d41,name);
  (*gl->renderbufferStorage)
            (0x8d41,info->m_format,(info->m_size).m_data[0],(info->m_size).m_data[1]);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Binding and setting storage for renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37b);
  (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Binding framebuffer and attaching renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37f);
  iVar3 = tcu::TextureFormat::getPixelSize(&format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&texelBlock,(long)iVar3,(allocator_type *)&texelAccess);
  dVar1 = info->m_format;
  bVar2 = glu::isCompressedFormat(dVar1);
  if (!bVar2) {
    TVar10 = glu::mapGLInternalFormat(dVar1);
    TVar5 = tcu::getTextureChannelClass(TVar10.type);
    if (TVar5 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      bVar2 = isFloatFormat(moreRestrictiveFormat);
      if (bVar2) {
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar3 = 0;
      }
      else {
        bVar2 = de::Random::getBool(rng);
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar3 = -(uint)bVar2;
      }
      memset(texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,iVar3,__n);
      goto LAB_013a26f5;
    }
  }
  iVar3 = tcu::TextureFormat::getPixelSize(&format);
  genTexel(rng,moreRestrictiveFormat,iVar3,1,
           texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start);
LAB_013a26f5:
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&texelAccess,&format,1,1,1,
             texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  bVar2 = isIntFormat(info->m_format);
  if (bVar2) {
    tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0)
    ;
    (*gl->clearBufferiv)(0x1800,0,color.m_data);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Failed to clear renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x39c);
    tcu::clear(&refAccess,&color);
  }
  else {
    bVar2 = isUintFormat(info->m_format);
    if (bVar2) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      (*gl->clearBufferuiv)(0x1800,0,(GLuint *)&color);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3a6);
      tcu::clear(&refAccess,&color);
    }
    else {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      bVar2 = tcu::isSRGB(format);
      if (bVar2) {
        tcu::sRGBToLinear((tcu *)&local_104,(Vec4 *)&color);
      }
      else {
        tcu::Vector<float,_4>::Vector(&local_104,(Vector<float,_4> *)&color);
      }
      bVar2 = isFloatFormat(info->m_format);
      if (bVar2) {
        (*gl->clearBufferfv)(0x1800,0,local_104.m_data);
      }
      else {
        (*gl->clearColor)(local_104.m_data[0],local_104.m_data[1],local_104.m_data[2],
                          local_104.m_data[3]);
        (*gl->clear)(0x4000);
      }
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3bf);
      tcu::clear(&refAccess,(Vec4 *)&color);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (*gl->bindRenderbuffer)(0x8d41,0);
  (*gl->bindFramebuffer)(0x8d40,0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to unbind renderbufer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x3c8);
  glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
  return;
}

Assistant:

void genImage (const glw::Functions&			gl,
			   de::Random&						rng,
			   deUint32							name,
			   vector<ArrayBuffer<deUint8> >&	levels,
			   const ImageInfo&					info,
			   deUint32							moreRestrictiveFormat)
{
	if (isTextureTarget(info.getTarget()))
		genTextureImage(gl, rng, name, levels, info, moreRestrictiveFormat);
	else
		genRenderbufferImage(gl, rng, name, levels, info, moreRestrictiveFormat);
}